

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::dht_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_error_alert *this)

{
  uint uVar1;
  error_category *peVar2;
  char *pcVar3;
  char msg [600];
  string sStack_2c8;
  string local_2a8;
  char local_288 [608];
  
  if ((ulong)this->op < 0x2b) {
    pcVar3 = operation_name::names[this->op];
  }
  else {
    pcVar3 = "unknown operation";
  }
  uVar1 = (this->error).val_;
  peVar2 = (this->error).cat_;
  (*peVar2->_vptr_error_category[4])(&sStack_2c8,peVar2,(ulong)uVar1);
  convert_from_native(&local_2a8,&sStack_2c8);
  snprintf(local_288,600,"DHT error [%s] (%d) %s",pcVar3,(ulong)uVar1,local_2a8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&sStack_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_288,(allocator<char> *)&local_2a8);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_error_alert::message() const
	{
		char msg[600];
		std::snprintf(msg, sizeof(msg), "DHT error [%s] (%d) %s"
			, operation_name(op)
			, error.value()
			, convert_from_native(error.message()).c_str());
		return msg;
	}